

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
            field_0x20 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x8c48c8;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0x8c49e0;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8c48f0;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8c4918;
  *(undefined8 *)((long)pvVar1 + -0x98) = 0x8c4940;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x8c4968;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x8c4990;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8c49b8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__008c4a00);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2));
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}